

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

Vec_Str_t *
Bmc_CollapseOne_int2
          (sat_solver *pSat1,sat_solver *pSat2,int nVars,int nCubeLim,int nBTLimit,int fCanon,
          int fReverse,int fVerbose)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Str_t *pVVar7;
  Vec_Int_t *p;
  Vec_Int_t *vLits;
  Vec_Int_t *vNums;
  Vec_Int_t *vTemp;
  abctime aVar8;
  ulong uVar9;
  char Fill;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  int iVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  uint local_ec;
  int pLits [2];
  long local_b8;
  Vec_Str_t *vSop [2];
  int local_88 [4];
  int local_78;
  int local_74;
  sat_solver *local_70;
  sat_solver *pSat [2];
  abctime Time [2] [2];
  
  uVar13 = (ulong)(uint)nVars;
  local_88[3] = fCanon;
  pSat[0] = pSat1;
  pSat[1] = pSat2;
  pVVar7 = Vec_StrAlloc(1000);
  vSop[0] = pVVar7;
  vSop[1] = Vec_StrAlloc(1000);
  iVar10 = nVars + 1;
  p = Vec_IntAlloc(iVar10);
  vLits = Vec_IntAlloc(iVar10);
  vNums = Vec_IntAlloc(iVar10);
  vTemp = Vec_IntAlloc(iVar10);
  Time[1][0] = 0;
  Time[1][1] = 0;
  Time[0][0] = 0;
  Time[0][1] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  uVar9 = uVar13;
  if (fReverse == 0) {
    iVar10 = 0;
    uVar9 = 0;
    if (0 < nVars) {
      uVar9 = uVar13;
    }
    while (iVar2 = (int)uVar9, uVar9 = (ulong)(iVar2 - 1), iVar2 != 0) {
      Vec_IntPush(p,iVar10 + 3);
      iVar10 = iVar10 + 1;
    }
  }
  else {
    while (iVar10 = (int)uVar9, 0 < iVar10) {
      Vec_IntPush(p,iVar10 + 2);
      uVar9 = (ulong)(iVar10 - 1);
    }
  }
  for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
    pLits[0] = (uint)lVar12 | 4;
    psVar1 = pSat[lVar12];
    iVar10 = sat_solver_solve(psVar1,pLits,pLits + 1,(long)nBTLimit,0,0,0);
    if (iVar10 == 0) {
      bVar14 = false;
LAB_00491729:
      iVar10 = 0;
      local_ec = 0;
      goto LAB_0049176a;
    }
    if (iVar10 == -1) {
      pVVar7->nSize = 0;
      pcVar11 = " 1\n";
      if (lVar12 == 0) {
        pcVar11 = " 0\n";
      }
      Vec_StrPrintStr(pVVar7,pcVar11);
      Vec_StrPush(pVVar7,'\0');
      bVar14 = true;
      goto LAB_00491729;
    }
    iVar10 = sat_solver_addclause(psVar1,pLits,pLits + 1);
    if (iVar10 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x4f7,
                    "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                   );
    }
    Vec_StrPush(vSop[lVar12],'\0');
  }
  local_b8 = 0;
  for (local_ec = 0; (int)local_ec < nCubeLim || nCubeLim == 0; local_ec = local_ec + 1) {
    for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
      if (fVerbose != 0) {
        local_b8 = Abc_Clock();
      }
      psVar1 = pSat[uVar9];
      iVar10 = p->nSize;
      sat_solver_clean_polarity(psVar1,p->pArray,iVar10);
      local_78 = (&DAT_00810d78)[uVar9];
      pLits[0] = Abc_Var2Lit(local_78,1);
      local_70 = psVar1;
      iVar2 = sat_solver_solve(psVar1,pLits,pLits + 1,0,0,0,0);
      if (fVerbose != 0) {
        aVar8 = Abc_Clock();
        Time[uVar9][0] = Time[uVar9][0] + (aVar8 - local_b8);
      }
      if (iVar2 == -1) {
LAB_004916aa:
        local_88[uVar9] = 1;
        break;
      }
      if (iVar2 == 0) {
        bVar14 = false;
        iVar10 = 0;
        goto LAB_0049176a;
      }
      vLits->nSize = 0;
      iVar2 = 0;
      if (iVar10 < 1) {
        iVar10 = iVar2;
      }
      for (; iVar10 != iVar2; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(p,iVar2);
        uVar4 = sat_solver_var_value(local_70,iVar3);
        iVar3 = Abc_Var2Lit(iVar3,uVar4 ^ 1);
        Vec_IntPush(vLits,iVar3);
      }
      if (fVerbose != 0) {
        local_b8 = Abc_Clock();
      }
      iVar10 = Bmc_CollapseExpand(pSat[uVar9 & 0xffffffff ^ 1],(sat_solver *)0x0,vLits,vNums,vTemp,
                                  nBTLimit,local_88[3],-1);
      if (fVerbose != 0) {
        aVar8 = Abc_Clock();
        Time[uVar9][1] = Time[uVar9][1] + (aVar8 - local_b8);
      }
      if (iVar10 < 0) {
        iVar10 = 0;
        bVar14 = false;
        goto LAB_0049176a;
      }
      pVVar7 = vSop[uVar9];
      Vec_StrPop(pVVar7);
      iVar10 = pVVar7->nSize;
      Vec_StrFillExtra(pVVar7,iVar10 + nVars + 4,Fill);
      local_74 = iVar10 + nVars;
      Vec_StrWriteEntry(pVVar7,iVar10 + nVars,' ');
      iVar3 = 0;
      Vec_StrWriteEntry(pVVar7,iVar10 + nVars + 1,(uVar9 == 0) + '0');
      Vec_StrWriteEntry(pVVar7,iVar10 + nVars + 2,'\n');
      Vec_StrWriteEntry(pVVar7,iVar10 + nVars + 3,'\0');
      vTemp->nSize = 0;
      iVar2 = Abc_Var2Lit(local_78,0);
      Vec_IntPush(vTemp,iVar2);
      iVar2 = vNums->nSize;
      if (vNums->nSize < 1) {
        iVar2 = iVar3;
      }
      for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
        uVar4 = Vec_IntEntry(vNums,iVar3);
        iVar5 = Vec_IntEntry(vLits,uVar4);
        iVar6 = Abc_LitNot(iVar5);
        Vec_IntPush(vTemp,iVar6);
        iVar6 = ~uVar4 + local_74;
        if (fReverse == 0) {
          iVar6 = uVar4 + iVar10;
        }
        iVar5 = Abc_LitIsCompl(iVar5);
        Vec_StrWriteEntry(pVVar7,iVar6,(byte)iVar5 ^ 0x31);
      }
      iVar10 = sat_solver_addclause(local_70,vTemp->pArray,vTemp->pArray + vTemp->nSize);
      if (iVar10 != 1) {
        if (iVar10 != 0) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                        ,0x536,
                        "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                       );
        }
        goto LAB_004916aa;
      }
    }
    iVar2 = local_88[0];
    iVar10 = local_88[1];
    if (local_88[0] != 0 || local_88[1] != 0) goto LAB_00491760;
  }
  iVar2 = 0;
  iVar10 = 0;
LAB_00491760:
  bVar14 = iVar2 != 0;
LAB_0049176a:
  Vec_IntFree(p);
  Vec_IntFree(vLits);
  Vec_IntFree(vNums);
  Vec_IntFree(vTemp);
  if ((bVar14) && (iVar10 != 0)) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x540,
                  "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                 );
  }
  if ((bool)(bVar14 | iVar10 != 0)) {
    pVVar7 = vSop[iVar10];
    vSop[iVar10] = (Vec_Str_t *)0x0;
    if (1 < local_ec) {
      Bmc_CollapseIrredundantFull(pVVar7,pVVar7->nSize / (nVars + 3),nVars);
    }
  }
  else {
    pVVar7 = (Vec_Str_t *)0x0;
  }
  if (fVerbose != 0) {
    printf("Processed output with %d supp vars. ",uVar13);
    if (pVVar7 == (Vec_Str_t *)0x0) {
      pcVar11 = "The resulting SOP exceeded %d cubes.\n";
      uVar9 = (ulong)(uint)nCubeLim;
    }
    else {
      pcVar11 = "The best cover contains %d cubes.\n";
      uVar9 = (long)pVVar7->nSize / (long)(nVars + 3) & 0xffffffff;
    }
    printf(pcVar11,uVar9);
    Abc_PrintTime(0x8111c4,(char *)Time[0][0],time);
    Abc_PrintTime(0x8111d3,(char *)Time[0][1],time_00);
    Abc_PrintTime(0x8111e2,(char *)Time[1][0],time_01);
    Abc_PrintTime(0x8111f1,(char *)Time[1][1],time_02);
  }
  Vec_StrFreeP(vSop);
  Vec_StrFreeP(vSop + 1);
  return pVVar7;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat1, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    sat_solver * pSat[2] = { pSat1, pSat2 };
    Vec_Str_t * vSop[2]  = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], pLits, pLits + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
//            pLits[1] = Abc_Var2Lit( iOutVar, n );    // set output
//            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            status = sat_solver_solve( pSat[n], pLits, pLits + 1, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
//            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            status = Bmc_CollapseExpand( pSat[!n], NULL, vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
//            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}